

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_lcl.c
# Opt level: O0

bool_t bignIsOperable(bign_params *params)

{
  bool_t bVar1;
  ulong count;
  long *in_RDI;
  size_t no;
  bool local_11;
  
  if (((*in_RDI == 0x80) || (*in_RDI == 0xc0)) || (local_11 = false, *in_RDI == 0x100)) {
    count = *in_RDI * 2 + 7U >> 3;
    local_11 = false;
    if (((count != 0) && (local_11 = false, (uint)*(byte *)(in_RDI + 1) % 4 == 3)) &&
       ((local_11 = false, (uint)*(byte *)(in_RDI + 0x19) % 2 == 1 &&
        ((local_11 = false, 0x7f < *(byte *)((long)in_RDI + count + 7) &&
         (local_11 = false, 0x7f < *(byte *)((long)in_RDI + count + 199))))))) {
      bVar1 = memIsZero((void *)((long)in_RDI + count + 8),0x40 - count);
      local_11 = false;
      if (bVar1 != 0) {
        bVar1 = memIsZero(in_RDI + 9,count);
        local_11 = false;
        if (bVar1 == 0) {
          bVar1 = memIsZero(in_RDI + 0x11,count);
          local_11 = false;
          if (bVar1 == 0) {
            bVar1 = memIsZero((void *)((long)in_RDI + count + 0x48),0x40 - count);
            local_11 = false;
            if (bVar1 != 0) {
              bVar1 = memIsZero((void *)((long)in_RDI + count + 0x88),0x40 - count);
              local_11 = false;
              if (bVar1 != 0) {
                bVar1 = memIsZero((void *)((long)in_RDI + count + 200),0x40 - count);
                local_11 = false;
                if (bVar1 != 0) {
                  bVar1 = memIsZero((void *)((long)in_RDI + count + 0x108),0x40 - count);
                  local_11 = bVar1 != 0;
                }
              }
            }
          }
        }
      }
    }
  }
  return (bool_t)local_11;
}

Assistant:

bool_t bignIsOperable(const bign_params* params)
{
	size_t no;
	// pre
	ASSERT(memIsValid(params, sizeof(bign_params)));
	// корректный уровень стойкости?
	// p mod 4 == 3? q mod 2 == 1?
	// p и q -- 2l-битовые?
	// a != 0? b != 0?
	// неиспользуемые октеты обнулены?
	return
		(params->l == 128 || params->l == 192 || params->l == 256) &&
		(no = O_OF_B(2 * params->l)) &&
		params->p[0] % 4 == 3 && params->q[0] % 2 == 1 &&
		params->p[no - 1] >= 128 && params->q[no - 1] >= 128 &&
		memIsZero(params->p + no, sizeof(params->p) - no) &&
		!memIsZero(params->a, no) &&
		!memIsZero(params->b, no) &&
		memIsZero(params->a + no, sizeof(params->a) - no) &&
		memIsZero(params->b + no, sizeof(params->b) - no) &&
		memIsZero(params->q + no, sizeof(params->q) - no) &&
		memIsZero(params->yG + no, sizeof(params->yG) - no);
}